

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void server_pull(int fd)

{
  pointer pbVar1;
  pointer pcVar2;
  int iVar3;
  size_t sVar4;
  undefined8 *puVar5;
  long *plVar6;
  pointer pbVar7;
  long lVar8;
  undefined1 *puVar9;
  ulong uVar10;
  size_type *psVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string file;
  string dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  server_hashes;
  string client_hash;
  undefined1 local_198 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  undefined1 *local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_130;
  pointer *local_118;
  long local_110;
  pointer local_108 [2];
  undefined1 *local_f8;
  size_t local_f0;
  undefined1 local_e8 [16];
  pointer local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,HEAD_abi_cxx11_._M_dataplus._M_p,
             HEAD_abi_cxx11_._M_dataplus._M_p + HEAD_abi_cxx11_._M_string_length);
  fileToMsg(&local_50,(Msg *)((long)register0x00000020 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  send(fd,(Msg *)((long)register0x00000020 + 8),0x7d4,0);
  recv(fd,(Msg *)((long)register0x00000020 + 8),0x7d4,0x100);
  if ((int)files.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish == 2) {
    return;
  }
  local_f8 = local_e8;
  sVar4 = strlen(&stack0x000003f4);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f8,&stack0x000003f4,&stack0x000003f4 + sVar4);
  read_all_lines_abi_cxx11_(&local_130,HEAD_abi_cxx11_._M_dataplus._M_p);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,HEAD_abi_cxx11_._M_dataplus._M_p,
             HEAD_abi_cxx11_._M_dataplus._M_p + HEAD_abi_cxx11_._M_string_length);
  fileToMsg(&local_70,(Msg *)((long)register0x00000020 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  send(fd,(Msg *)((long)register0x00000020 + 8),0x7d4,0);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,LOG_abi_cxx11_._M_dataplus._M_p,
             LOG_abi_cxx11_._M_dataplus._M_p + LOG_abi_cxx11_._M_string_length);
  fileToMsg(&local_90,(Msg *)((long)register0x00000020 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  send(fd,(Msg *)((long)register0x00000020 + 8),0x7d4,0);
  iVar3 = std::__cxx11::string::compare((char *)&local_f8);
  if (iVar3 == 0) {
    puVar9 = (undefined1 *)0x0;
    pbVar7 = local_130.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    local_158 = local_f8;
    local_d8 = local_130.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    psVar11 = &(local_130.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    lVar8 = 0x100000000;
    while ((local_f0 != *psVar11 ||
           ((local_f0 != 0 &&
            (iVar3 = bcmp(local_158,
                          (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (psVar11 + -1))->_M_dataplus)._M_p,local_f0), iVar3 != 0))))) {
      lVar8 = lVar8 + 0x100000000;
      psVar11 = psVar11 + 4;
    }
    puVar9 = (undefined1 *)(lVar8 >> 0x20);
    pbVar7 = local_d8;
  }
  if (puVar9 < (undefined1 *)
               ((long)local_130.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5)) {
    do {
      local_198._0_8_ = local_198 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_198,COMMITS_DIR_abi_cxx11_._M_dataplus._M_p,
                 COMMITS_DIR_abi_cxx11_._M_dataplus._M_p + COMMITS_DIR_abi_cxx11_._M_string_length);
      std::__cxx11::string::append(local_198);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      pcVar2 = local_130.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)puVar9]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,pcVar2,
                 pcVar2 + local_130.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[(long)puVar9]._M_string_length);
      deleteEndl(&local_d0);
      pbVar7 = (pointer)0xf;
      if ((pointer)local_198._0_8_ != (pointer)(local_198 + 0x10)) {
        pbVar7 = (pointer)local_198._16_8_;
      }
      pbVar1 = (pointer)((long)&((_Alloc_hider *)local_198._8_8_)->_M_p + local_110);
      if (pbVar7 < pbVar1) {
        pbVar7 = (pointer)0xf;
        if (local_118 != local_108) {
          pbVar7 = local_108[0];
        }
        if (pbVar7 < pbVar1) goto LAB_0010ccc0;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,local_198._0_8_);
      }
      else {
LAB_0010ccc0:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append(local_198,(ulong)local_118);
      }
      local_178._M_allocated_capacity = (size_type)&local_168;
      psVar11 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_168._M_allocated_capacity = *psVar11;
        local_168._8_8_ = puVar5[3];
      }
      else {
        local_168._M_allocated_capacity = *psVar11;
        local_178._M_allocated_capacity =
             (size_type)
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar5;
      }
      local_178._8_8_ = puVar5[1];
      *puVar5 = psVar11;
      puVar5[1] = 0;
      *(undefined1 *)psVar11 = 0;
      plVar6 = (long *)std::__cxx11::string::append(local_178._M_local_buf);
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      psVar11 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_150.field_2._M_allocated_capacity = *psVar11;
        local_150.field_2._8_8_ = plVar6[3];
      }
      else {
        local_150.field_2._M_allocated_capacity = *psVar11;
        local_150._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_150._M_string_length = plVar6[1];
      *plVar6 = (long)psVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_allocated_capacity != &local_168) {
        operator_delete((void *)local_178._M_allocated_capacity);
      }
      if (local_118 != local_108) {
        operator_delete(local_118);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      local_158 = puVar9;
      if ((pointer)local_198._0_8_ != (pointer)(local_198 + 0x10)) {
        operator_delete((void *)local_198._0_8_);
      }
      ls_abi_cxx11_((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_198,local_150._M_dataplus._M_p);
      if (local_198._8_8_ != local_198._0_8_) {
        lVar8 = 0;
        uVar10 = 0;
        do {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_178,&local_150,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&((_Alloc_hider *)local_198._0_8_)->_M_p + lVar8));
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,local_178._M_allocated_capacity,
                     (char *)(local_178._M_allocated_capacity + local_178._8_8_));
          fileToMsg(&local_b0,(Msg *)((long)register0x00000020 + 8));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          files.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
          send(fd,(Msg *)((long)register0x00000020 + 8),0x7d4,0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_allocated_capacity != &local_168) {
            operator_delete((void *)local_178._M_allocated_capacity);
          }
          uVar10 = uVar10 + 1;
          lVar8 = lVar8 + 0x20;
        } while (uVar10 < (ulong)((long)(local_198._8_8_ - local_198._0_8_) >> 5));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_198);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
      }
      puVar9 = local_158 + 1;
    } while (puVar9 < (undefined1 *)
                      ((long)local_130.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_130.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 2;
  send(fd,(Msg *)((long)register0x00000020 + 8),0x7d4,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_130);
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  return;
}

Assistant:

void server_pull(int fd, Msg msg) {
    fileToMsg(HEAD,msg);
    msg.type = MSG_PULL;
    send(fd,&msg,sizeof(msg),0);
    recv(fd, &msg, sizeof(msg), MSG_WAITALL);
    if(msg.type == MSG_END) return;
    String client_hash = msg.buf2;
    Vector<String> server_hashes = read_all_lines(HEAD.c_str());
    fileToMsg(HEAD,msg);
    msg.type = MSG_PULL;
    send(fd,&msg,sizeof(msg),0);
    fileToMsg(LOG,msg);
    send(fd,&msg,sizeof(msg),0);
    int i = 0;
    if(client_hash != ""){
        while(client_hash != server_hashes[i]){
            i++;
        }
        i++;
    }
    while(i<server_hashes.size()){
        String dir = COMMITS_DIR + "/" + deleteEndl(server_hashes[i]) + "/";
        Vector<String> files = ls(dir.c_str());
        for(int j = 0; j < files.size();j++){
            String file = dir + files[j];
            fileToMsg(file,msg);
            msg.type = MSG_PULL;
            send(fd,&msg,sizeof(msg),0);
        }
        i++;
    }
    msg.type = MSG_END;
    send(fd,&msg,sizeof(msg),0);
}